

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3HaltConstraint(Parse *pParse,int errCode,int onError,char *p4,i8 p4type,u8 p5Errmsg)

{
  Vdbe *p;
  char cVar1;
  undefined8 in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  Parse *in_RDI;
  int in_R8D;
  byte in_R9B;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int iVar2;
  int in_stack_ffffffffffffffe0;
  
  cVar1 = (char)in_R8D;
  iVar2 = in_EDX;
  p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (in_EDX == 2) {
    sqlite3MayAbort(in_RDI);
  }
  sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_ESI,iVar2),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8D,
                    in_stack_ffffffffffffffc0,(char *)CONCAT44(in_stack_ffffffffffffffbc,(int)cVar1)
                    ,in_stack_ffffffffffffffe0);
  sqlite3VdbeChangeP5(p,(ushort)in_R9B);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3HaltConstraint(
  Parse *pParse,    /* Parsing context */
  int errCode,      /* extended error code */
  int onError,      /* Constraint type */
  char *p4,         /* Error message */
  i8 p4type,        /* P4_STATIC or P4_TRANSIENT */
  u8 p5Errmsg       /* P5_ErrMsg type */
){
  Vdbe *v;
  assert( pParse->pVdbe!=0 );
  v = sqlite3GetVdbe(pParse);
  assert( (errCode&0xff)==SQLITE_CONSTRAINT || pParse->nested );
  if( onError==OE_Abort ){
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(v, OP_Halt, errCode, onError, 0, p4, p4type);
  sqlite3VdbeChangeP5(v, p5Errmsg);
}